

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O0

int WebRtcIsac_DecHistBisectMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *cdf_size,int N)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int local_68;
  int local_64;
  int k;
  int size_tmp;
  uint16_t *cdf_ptr;
  uint8_t *stream_ptr;
  uint32_t streamval;
  uint32_t W_upper_MSB;
  uint32_t W_upper_LSB;
  uint32_t W_tmp;
  uint32_t W_upper;
  uint32_t W_lower;
  int N_local;
  uint16_t *cdf_size_local;
  uint16_t **cdf_local;
  Bitstr *streamdata_local;
  int *data_local;
  
  W_tmp = 0;
  cdf_ptr = (uint16_t *)(streamdata->stream + streamdata->stream_index);
  W_upper_LSB = streamdata->W_upper;
  if (W_upper_LSB == 0) {
    data_local._4_4_ = -2;
  }
  else {
    local_68 = N;
    _W_lower = cdf_size;
    cdf_size_local = (uint16_t *)cdf;
    streamdata_local = (Bitstr *)data;
    if (streamdata->stream_index == 0) {
      stream_ptr._4_4_ =
           (uint)*(uint8_t *)((long)cdf_ptr + 3) |
           (uint)*(uint8_t *)((long)cdf_ptr + 2) << 8 |
           (uint)*(uint8_t *)((long)cdf_ptr + 1) << 0x10 | (uint)*(byte *)cdf_ptr << 0x18;
      cdf_ptr = (uint16_t *)((long)cdf_ptr + 3);
    }
    else {
      stream_ptr._4_4_ = streamdata->streamval;
    }
    for (; 0 < local_68; local_68 = local_68 + -1) {
      uVar1 = W_upper_LSB & 0xffff;
      uVar2 = W_upper_LSB >> 0x10;
      local_64 = (int)(uint)*_W_lower >> 1;
      _k = (ushort *)(*(long *)cdf_size_local + (long)(local_64 + -1) * 2);
      while( true ) {
        uVar3 = (uVar1 * *_k >> 0x10) + uVar2 * *_k;
        local_64 = local_64 >> 1;
        if (local_64 == 0) break;
        if (uVar3 < stream_ptr._4_4_) {
          lVar4 = (long)local_64 * 2;
          W_tmp = uVar3;
        }
        else {
          lVar4 = (long)local_64 * -2;
          W_upper_LSB = uVar3;
        }
        _k = (ushort *)((long)_k + lVar4);
      }
      if (uVar3 < stream_ptr._4_4_) {
        *(int *)streamdata_local->stream = (int)((long)_k - *(long *)cdf_size_local >> 1);
        W_tmp = uVar3;
      }
      else {
        *(int *)streamdata_local->stream = (int)((long)_k - *(long *)cdf_size_local >> 1) + -1;
        W_upper_LSB = uVar3;
      }
      streamdata_local = (Bitstr *)(streamdata_local->stream + 4);
      cdf_size_local = cdf_size_local + 4;
      W_tmp = W_tmp + 1;
      stream_ptr._4_4_ = stream_ptr._4_4_ - W_tmp;
      for (W_upper_LSB = W_upper_LSB - W_tmp; (W_upper_LSB & 0xff000000) == 0;
          W_upper_LSB = W_upper_LSB << 8) {
        stream_ptr._4_4_ = stream_ptr._4_4_ << 8 | (uint)*(byte *)((long)cdf_ptr + 1);
        cdf_ptr = (uint16_t *)((long)cdf_ptr + 1);
      }
      if (W_upper_LSB == 0) {
        return -2;
      }
      _W_lower = _W_lower + 1;
    }
    streamdata->stream_index = (int)cdf_ptr - (int)streamdata;
    streamdata->W_upper = W_upper_LSB;
    streamdata->streamval = stream_ptr._4_4_;
    if (W_upper_LSB < 0x2000000) {
      data_local._4_4_ = streamdata->stream_index - 1;
    }
    else {
      data_local._4_4_ = streamdata->stream_index - 2;
    }
  }
  return data_local._4_4_;
}

Assistant:

int WebRtcIsac_DecHistBisectMulti(int *data,     /* output: data vector */
                                  Bitstr *streamdata,   /* in-/output struct containing bitstream */
                                  const uint16_t **cdf,  /* input: array of cdf arrays */
                                  const uint16_t *cdf_size, /* input: array of cdf table sizes+1 (power of two: 2^k) */
                                  const int N)    /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     size_tmp;
  int     k;

  W_lower = 0; //to remove warning -DH
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }

  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start halfway the cdf range */
    size_tmp = *cdf_size++ >> 1;
    cdf_ptr = *cdf + (size_tmp - 1);

    /* method of bisection */
    for ( ;; )
    {
      W_tmp = W_upper_MSB * *cdf_ptr;
      W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
      size_tmp >>= 1;
      if (size_tmp == 0) break;
      if (streamval > W_tmp)
      {
        W_lower = W_tmp;
        cdf_ptr += size_tmp;
      } else {
        W_upper = W_tmp;
        cdf_ptr -= size_tmp;
      }
    }
    if (streamval > W_tmp)
    {
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    } else {
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }

    if (W_upper == 0)
      /* Should not be possible in normal operation */
      return -2;


  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}